

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

BasicBlock * __thiscall Loop::GetAnyTailBlock(Loop *this)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  Loop *currentLoop;
  BasicBlock *pBVar4;
  undefined4 *puVar5;
  Type *ppFVar6;
  Loop *pLVar7;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  Iterator local_40;
  
  pBVar4 = GetHeadBlock(this);
  pSVar8 = &(pBVar4->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_40.list = pSVar8;
  local_40.current = &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pBVar4 = (BasicBlock *)0x0;
  while( true ) {
    if (pSVar8 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_0041a45e;
      *puVar5 = 0;
      pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    }
    pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
              &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (pSVar8 == local_40.list) break;
    local_40.current = (NodeBase *)pSVar8;
    ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    pBVar1 = (*ppFVar6)->predBlock;
    if (pBVar1 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xe61,"(pred)","pred");
      if (!bVar3) goto LAB_0041a45e;
      *puVar5 = 0;
    }
    pLVar7 = pBVar1->loop;
    bVar3 = pLVar7 != (Loop *)0x0;
    if (pLVar7 != this && bVar3) {
      do {
        pLVar7 = pLVar7->parent;
        bVar3 = pLVar7 != (Loop *)0x0;
        if (pLVar7 == this) break;
      } while (pLVar7 != (Loop *)0x0);
    }
    pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    if (bVar3) {
      pBVar4 = pBVar1;
    }
  }
  if (pBVar4 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xe69,"(tail)","tail");
    if (!bVar3) {
LAB_0041a45e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return pBVar4;
}

Assistant:

BasicBlock *
Loop::GetAnyTailBlock() const
{
    BasicBlock * tail = nullptr;

    BasicBlock * loopHeader = this->GetHeadBlock();
    FOREACH_PREDECESSOR_BLOCK(pred, loopHeader)
    {
        if (this->IsDescendentOrSelf(pred->loop))
        {
            tail = pred;
        }
    } NEXT_PREDECESSOR_BLOCK;
    
    Assert(tail);
    return tail;
}